

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter.cc
# Opt level: O3

Info * re2::Prefilter::Info::Literal(Rune r)

{
  int iVar1;
  Info *this;
  _Rb_tree_header *p_Var2;
  char buf [4];
  char local_50 [4];
  Rune local_4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this = (Info *)operator_new(0x40);
  p_Var2 = &(this->exact_)._M_t._M_impl.super__Rb_tree_header;
  (this->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->exact_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->is_exact_ = false;
  this->match_ = (Prefilter *)0x0;
  local_4c = ToLowerRune(r);
  iVar1 = runetochar(local_50,&local_4c);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,local_50,local_50 + iVar1);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  this->is_exact_ = true;
  return this;
}

Assistant:

Prefilter::Info* Prefilter::Info::Literal(Rune r) {
  Info* info = new Info();
  info->exact_.insert(RuneToString(ToLowerRune(r)));
  info->is_exact_ = true;
  return info;
}